

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_strncat_l(archive_string *as,void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  size_t s_00;
  int *piVar3;
  int local_50;
  wchar_t tn;
  wchar_t r2;
  wchar_t r;
  wchar_t i;
  size_t length;
  void *s;
  archive_string_conv *sc_local;
  size_t n_local;
  void *_p_local;
  archive_string *as_local;
  
  tn = L'\0';
  if ((_p == (void *)0x0) || (n == 0)) {
    local_50 = 1;
    if ((sc != (archive_string_conv *)0x0) && ((sc->flag & 0x1400U) != 0)) {
      local_50 = 2;
    }
    paVar2 = archive_string_ensure(as,as->length + (long)local_50);
    if (paVar2 == (archive_string *)0x0) {
      as_local._4_4_ = L'\xffffffff';
    }
    else {
      as->s[as->length] = '\0';
      if (local_50 == 2) {
        as->s[as->length + 1] = '\0';
      }
      as_local._4_4_ = L'\0';
    }
  }
  else if (sc == (archive_string_conv *)0x0) {
    s_00 = mbsnbytes(_p,n);
    paVar2 = archive_string_append(as,(char *)_p,s_00);
    if (paVar2 == (archive_string *)0x0) {
      as_local._4_4_ = L'\xffffffff';
    }
    else {
      as_local._4_4_ = L'\0';
    }
  }
  else {
    if ((sc->flag & 0x2800U) == 0) {
      _r = mbsnbytes(_p,n);
    }
    else {
      _r = utf16nbytes(_p,n);
    }
    r2 = L'\0';
    length = (size_t)_p;
    if (L'\x01' < sc->nconverter) {
      (sc->utftmp).length = 0;
      wVar1 = (*sc->converter[0])(&sc->utftmp,_p,_r,sc);
      if ((wVar1 != L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        return wVar1;
      }
      if (wVar1 < L'\0') {
        tn = wVar1;
      }
      length = (size_t)(sc->utftmp).s;
      _r = (sc->utftmp).length;
      r2 = L'\x01';
    }
    wVar1 = (*sc->converter[r2])(as,(void *)length,_r,sc);
    if (wVar1 < tn) {
      tn = wVar1;
    }
    as_local._4_4_ = tn;
  }
  return as_local._4_4_;
}

Assistant:

int
archive_strncat_l(struct archive_string *as, const void *_p, size_t n,
    struct archive_string_conv *sc)
{
	const void *s;
	size_t length;
	int i, r = 0, r2;

	/* We must allocate memory even if there is no data for conversion
	 * or copy. This simulates archive_string_append behavior. */
	if (_p == NULL || n == 0) {
		int tn = 1;
		if (sc != NULL && (sc->flag & SCONV_TO_UTF16))
			tn = 2;
		if (archive_string_ensure(as, as->length + tn) == NULL)
			return (-1);
		as->s[as->length] = 0;
		if (tn == 2)
			as->s[as->length+1] = 0;
		return (0);
	}

	/*
	 * If sc is NULL, we just make a copy.
	 */
	if (sc == NULL) {
		length = mbsnbytes(_p, n);
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (0);
	}

	if (sc->flag & SCONV_FROM_UTF16)
		length = utf16nbytes(_p, n);
	else
		length = mbsnbytes(_p, n);
	s = _p;
	i = 0;
	if (sc->nconverter > 1) {
		sc->utftmp.length = 0;
		r2 = sc->converter[0](&(sc->utftmp), s, length, sc);
		if (r2 != 0 && errno == ENOMEM)
			return (r2);
		if (r > r2)
			r = r2;
		s = sc->utftmp.s;
		length = sc->utftmp.length;
		++i;
	}
	r2 = sc->converter[i](as, s, length, sc);
	if (r > r2)
		r = r2;
	return (r);
}